

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Output::mapTag(Output *this,StringRef Tag,bool Use)

{
  SmallVector<llvm::yaml::Output::InState,_8U> *this_00;
  reference pIVar1;
  undefined3 in_register_00000009;
  ulong uVar2;
  StringRef s;
  StringRef s_00;
  InState local_34;
  
  if (CONCAT31(in_register_00000009,Use) != 0) {
    uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                   super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                   super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                   super_SmallVectorBase.Size;
    if (1 < uVar2) {
      this_00 = &this->StateStack;
      pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00,
                          uVar2 - 2);
      if (*pIVar1 < inMapFirstKey) {
        pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                           ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00)
        ;
        if (*pIVar1 == inMapFirstKey) {
          newLineCheck(this);
        }
        else {
          s_00.Length = 1;
          s_00.Data = " ";
          output(this,s_00);
        }
        output(this,Tag);
        pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                           ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00)
        ;
        if (*pIVar1 == inMapFirstKey) {
          SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
                    ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)this_00);
          SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
                    ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)this_00,&local_34
                    );
        }
        (this->Padding).Data = "\n";
        (this->Padding).Length = 1;
        return Use;
      }
    }
    s.Length = 1;
    s.Data = " ";
    output(this,s);
    output(this,Tag);
  }
  return Use;
}

Assistant:

bool Output::mapTag(StringRef Tag, bool Use) {
  if (Use) {
    // If this tag is being written inside a sequence we should write the start
    // of the sequence before writing the tag, otherwise the tag won't be
    // attached to the element in the sequence, but rather the sequence itself.
    bool SequenceElement = false;
    if (StateStack.size() > 1) {
      auto &E = StateStack[StateStack.size() - 2];
      SequenceElement = inSeqAnyElement(E) || inFlowSeqAnyElement(E);
    }
    if (SequenceElement && StateStack.back() == inMapFirstKey) {
      newLineCheck();
    } else {
      output(" ");
    }
    output(Tag);
    if (SequenceElement) {
      // If we're writing the tag during the first element of a map, the tag
      // takes the place of the first element in the sequence.
      if (StateStack.back() == inMapFirstKey) {
        StateStack.pop_back();
        StateStack.push_back(inMapOtherKey);
      }
      // Tags inside maps in sequences should act as keys in the map from a
      // formatting perspective, so we always want a newline in a sequence.
      Padding = "\n";
    }
  }
  return Use;
}